

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O2

void test_times_called(Constraint *constraint,char *function,CgreenValue actual,char *test_file,
                      int test_line,TestReporter *reporter)

{
  _func_void_TestReporter_ptr_char_ptr_int_int_char_ptr_varargs *p_Var1;
  _Bool _Var2;
  char *__ptr;
  char parameter_name_actual_string [255];
  
  __snprintf_chk(parameter_name_actual_string,0xfe,1,0xff,"%s",function);
  __ptr = (*constraint->failure_message)
                    (constraint,parameter_name_actual_string,actual.value.integer_value);
  p_Var1 = reporter->assert_true;
  _Var2 = (*constraint->compare)(constraint,actual);
  (*p_Var1)(reporter,test_file,test_line,(uint)_Var2,__ptr);
  free(__ptr);
  return;
}

Assistant:

void test_times_called(Constraint *constraint, const char *function, CgreenValue actual,
               const char *test_file, int test_line, TestReporter *reporter) {
    char *message;
    char parameter_name_actual_string[255];

    snprintf(parameter_name_actual_string, sizeof(parameter_name_actual_string) - 1, "%s", function);
    message = constraint->failure_message(constraint, parameter_name_actual_string, actual.value.integer_value);

    (*reporter->assert_true)(
            reporter,
            test_file,
            test_line,
            (*constraint->compare)(constraint, actual),
            message);

    free(message);
}